

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::tree_node<int,_false>_> __thiscall
immutable::rrb_details::rrb_drop_left_rec<int,false,6>
          (rrb_details *this,uint32_t *total_shift,
          ref<immutable::rrb_details::tree_node<int,_false>_> *root,uint32_t left,uint32_t shift,
          bool has_right)

{
  undefined4 *__s;
  ref<immutable::rrb_details::rrb_size_table<false>_> *__dest;
  int *piVar1;
  rrb_size_table<false> *prVar2;
  uint32_t *puVar3;
  undefined1 auVar4 [16];
  ref<immutable::rrb_details::internal_node<int,_false>_> rVar5;
  undefined4 *puVar6;
  internal_node<int,_false> *piVar7;
  ulong uVar8;
  uint32_t uVar9;
  char *__function;
  int iVar10;
  uint uVar11;
  undefined4 in_register_00000084;
  uint uVar12;
  uint32_t uVar13;
  tree_node<int,_false> *ptVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ref<immutable::rrb_details::internal_node<int,_false>_> internal_left_hand_node;
  ref<immutable::rrb_details::tree_node<int,_false>_> left_hand_node;
  ref<immutable::rrb_details::tree_node<int,_false>_> child;
  ref<immutable::rrb_details::rrb_size_table<false>_> sliced_table;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_90;
  internal_node<int,_false> *local_88;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_80;
  uint32_t local_74;
  undefined8 local_70;
  tree_node<int,_false> *local_68;
  rrb_size_table<false> *local_60;
  size_t local_58;
  uint32_t *local_50;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_48;
  ref<immutable::rrb_details::rrb_size_table<false>_> *local_40;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_38;
  
  uVar12 = left >> ((byte)shift & 0x1f);
  piVar7 = (internal_node<int,_false> *)root->ptr;
  local_68 = (tree_node<int,_false> *)this;
  if (shift == 0) {
    if (piVar7 != (internal_node<int,_false> *)0x0) {
      piVar7->_ref_count = piVar7->_ref_count + 1;
      uVar9 = piVar7->len;
      uVar15 = (ulong)(uVar9 - uVar12);
      local_50 = total_shift;
      puVar6 = (undefined4 *)malloc(uVar15 * 4 + 0x18);
      __s = puVar6 + 6;
      iVar10 = uVar9 - uVar12;
      puVar6[1] = iVar10;
      *puVar6 = 0;
      *(undefined4 **)(puVar6 + 4) = __s;
      puVar6[3] = 0;
      if (iVar10 == 0) {
        puVar6[2] = 1;
      }
      else {
        uVar8 = 0;
        memset(__s,0,uVar15 * 4);
        puVar6[2] = 1;
        prVar2 = (piVar7->size_table).ptr;
        do {
          __s[uVar8] = *(undefined4 *)((long)&prVar2->size + (ulong)(uVar12 + (int)uVar8) * 4);
          uVar8 = uVar8 + 1;
        } while (uVar15 != uVar8);
      }
      ptVar14 = local_68;
      *local_50 = 0;
      *(undefined4 **)local_68 = puVar6;
      uVar9 = piVar7->_ref_count;
      piVar7->_ref_count = uVar9 - 1;
      if (uVar9 != 1) {
        return (ref<immutable::rrb_details::tree_node<int,_false>_>)local_68;
      }
      free(piVar7);
      return (ref<immutable::rrb_details::tree_node<int,_false>_>)ptVar14;
    }
    __function = 
    "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
    ;
    local_50 = total_shift;
    goto LAB_00148650;
  }
  if (piVar7 != (internal_node<int,_false> *)0x0) {
    piVar7->_ref_count = piVar7->_ref_count + 1;
    prVar2 = (piVar7->size_table).ptr;
    if (prVar2 == (rrb_size_table<false> *)0x0) {
      uVar9 = left - (uVar12 << ((byte)shift & 0x1f));
    }
    else {
      puVar3 = prVar2->size;
      uVar15 = (ulong)(uVar12 - 1);
      do {
        uVar8 = uVar15;
        uVar12 = (int)uVar8 + 1;
        uVar15 = (ulong)uVar12;
      } while (puVar3[uVar12] <= left);
      if (uVar12 == 0) {
        uVar12 = 0;
        uVar9 = left;
      }
      else {
        uVar9 = left - puVar3[uVar8];
      }
    }
    uVar11 = piVar7->len - 1;
    local_48.ptr = (tree_node<int,_false> *)piVar7->child[uVar12].ptr;
    if ((internal_node<int,_false> *)local_48.ptr != (internal_node<int,_false> *)0x0) {
      ((internal_node<int,_false> *)local_48.ptr)->_ref_count =
           ((internal_node<int,_false> *)local_48.ptr)->_ref_count + 1;
    }
    local_88 = piVar7;
    local_70 = CONCAT44(in_register_00000084,shift);
    rrb_drop_left_rec<int,false,6>
              ((rrb_details *)&local_80,total_shift,&local_48,uVar9,shift - 6,
               uVar12 != uVar11 || has_right);
    if (uVar12 != uVar11) {
      local_74 = local_88->len;
      uVar11 = local_74 - uVar12;
      uVar15 = (ulong)uVar11;
      local_58 = uVar15 * 8;
      local_50 = total_shift;
      piVar7 = (internal_node<int,_false> *)malloc(uVar15 * 8 + 0x20);
      piVar7->len = uVar11;
      piVar7->type = INTERNAL_NODE;
      local_40 = &piVar7->size_table;
      (piVar7->size_table).ptr = (rrb_size_table<false> *)0x0;
      piVar7->guid = 0;
      piVar7->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar7 + 1);
      memset(piVar7 + 1,0,local_58);
      piVar7->_ref_count = 1;
      local_58 = (ulong)uVar12;
      for (lVar16 = 0; uVar12 = uVar12 + 1, (ulong)(uVar11 - 1) << 3 != lVar16; lVar16 = lVar16 + 8)
      {
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   ((long)&piVar7->child[1].ptr + lVar16),local_88->child + uVar12);
      }
      prVar2 = (local_88->size_table).ptr;
      if (prVar2 != (rrb_size_table<false> *)0x0) {
        prVar2->_ref_count = prVar2->_ref_count + 1;
      }
      local_90.ptr = (internal_node<int,_false> *)malloc(uVar15 * 4 + 0x10);
      __dest = &(local_90.ptr)->size_table;
      *(ref<immutable::rrb_details::rrb_size_table<false>_> **)local_90.ptr = __dest;
      (local_90.ptr)->guid = 0;
      (local_90.ptr)->_ref_count = 1;
      auVar4 = _DAT_00153110;
      uVar13 = (uint32_t)local_58;
      uVar9 = (uint32_t)local_70;
      local_60 = prVar2;
      if (prVar2 == (rrb_size_table<false> *)0x0) {
        if (local_74 != uVar13) {
          lVar16 = uVar15 - 1;
          auVar17._8_4_ = (int)lVar16;
          auVar17._0_8_ = lVar16;
          auVar17._12_4_ = (int)((ulong)lVar16 >> 0x20);
          uVar8 = 0;
          auVar17 = auVar17 ^ _DAT_00153110;
          auVar18 = _DAT_00153100;
          do {
            auVar19 = auVar18 ^ auVar4;
            if ((bool)(~(auVar19._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar19._0_4_ ||
                        auVar17._4_4_ < auVar19._4_4_) & 1)) {
              *(uint32_t *)((long)&((local_90.ptr)->size_table).ptr + uVar8 * 4) =
                   uVar13 + 1 + (int)uVar8 << ((byte)local_70 & 0x1f);
            }
            if ((auVar19._12_4_ != auVar17._12_4_ || auVar19._8_4_ <= auVar17._8_4_) &&
                auVar19._12_4_ <= auVar17._12_4_) {
              *(uint32_t *)((long)&((local_90.ptr)->size_table).ptr + uVar8 * 4 + 4) =
                   uVar13 + 2 + (int)uVar8 << ((byte)local_70 & 0x1f);
            }
            uVar8 = uVar8 + 2;
            lVar16 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 2;
            auVar18._8_8_ = lVar16 + 2;
          } while ((uVar15 + 1 & 0xfffffffffffffffe) != uVar8);
        }
      }
      else {
        memcpy(__dest,prVar2->size + local_58,uVar15 * 4);
      }
      if (local_74 != uVar13) {
        uVar8 = 0;
        do {
          piVar1 = (int *)((long)&__dest->ptr + uVar8 * 4);
          *piVar1 = *piVar1 - left;
          uVar8 = uVar8 + 1;
        } while (uVar15 != uVar8);
      }
      ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                (local_40,(ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_90);
      ref<immutable::rrb_details::internal_node<int,false>>::operator=
                ((ref<immutable::rrb_details::internal_node<int,false>> *)piVar7->child,&local_80);
      ptVar14 = local_68;
      *local_50 = uVar9;
      piVar7->_ref_count = piVar7->_ref_count + 1;
      *(internal_node<int,_false> **)local_68 = piVar7;
      if ((local_90.ptr != (internal_node<int,_false> *)0x0) &&
         (uVar9 = (local_90.ptr)->_ref_count, (local_90.ptr)->_ref_count = uVar9 - 1, uVar9 == 1)) {
        free(local_90.ptr);
      }
      if ((local_60 != (rrb_size_table<false> *)0x0) &&
         (uVar9 = local_60->_ref_count, local_60->_ref_count = uVar9 - 1, uVar9 == 1)) {
        free(local_60);
      }
      release<int>(piVar7);
      goto LAB_001485f4;
    }
    if (!has_right) {
      *(tree_node<int,_false> **)local_68 = local_80.ptr;
      ptVar14 = local_68;
      if ((internal_node<int,_false> *)local_80.ptr != (internal_node<int,_false> *)0x0) {
        (local_80.ptr)->_ref_count = (local_80.ptr)->_ref_count + 1;
      }
      goto LAB_001485f4;
    }
    piVar7 = (internal_node<int,_false> *)malloc(0x28);
    ptVar14 = local_68;
    piVar7->type = INTERNAL_NODE;
    piVar7->len = 1;
    (piVar7->size_table).ptr = (rrb_size_table<false> *)0x0;
    piVar7->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar7 + 1);
    piVar7[1].type = LEAF_NODE;
    piVar7[1].len = 0;
    piVar7->_ref_count = 1;
    piVar7->guid = 0;
    local_90.ptr = (internal_node<int,_false> *)local_80.ptr;
    if ((internal_node<int,_false> *)local_80.ptr != (internal_node<int,_false> *)0x0) {
      (local_80.ptr)->_ref_count = (local_80.ptr)->_ref_count + 1;
    }
    ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
              ((ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar7 + 1),&local_90);
    rVar5.ptr = local_90.ptr;
    uVar9 = (uint32_t)local_70;
    if (shift - 6 != 0) {
      if (local_90.ptr == (internal_node<int,_false> *)0x0) goto LAB_00148624;
      prVar2 = ((local_90.ptr)->size_table).ptr;
      if (prVar2 != (rrb_size_table<false> *)0x0) {
        local_38.ptr = (rrb_size_table<false> *)malloc(0x14);
        (local_38.ptr)->size = (uint32_t *)(local_38.ptr + 1);
        (local_38.ptr)->guid = 0;
        (local_38.ptr)->_ref_count = 1;
        *(uint32_t *)&local_38.ptr[1].size = prVar2->size[(rVar5.ptr)->len - 1];
        ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                  (&piVar7->size_table,&local_38);
        uVar9 = (uint32_t)local_70;
        if ((local_38.ptr != (rrb_size_table<false> *)0x0) &&
           (uVar13 = (local_38.ptr)->_ref_count, (local_38.ptr)->_ref_count = uVar13 - 1,
           uVar13 == 1)) {
          free(local_38.ptr);
        }
      }
    }
    *total_shift = uVar9;
    *(internal_node<int,_false> **)ptVar14 = piVar7;
    piVar7->_ref_count = piVar7->_ref_count + 1;
    release<int>(local_90.ptr);
    release<int>(piVar7);
LAB_001485f4:
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_80);
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_48);
    release<int>(local_88);
    return (ref<immutable::rrb_details::tree_node<int,_false>_>)ptVar14;
  }
LAB_00148624:
  __function = 
  "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
  ;
LAB_00148650:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<tree_node<T, atomic_ref_counting>> rrb_drop_left_rec(uint32_t *total_shift, const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t left, uint32_t shift, bool has_right)
      {
      const uint32_t subshift = shift - bits<N>::rrb_bits;
      uint32_t subidx = left >> shift;
      if (shift > 0)
        {
        ref<internal_node<T, atomic_ref_counting>> internal_root = root;
        uint32_t idx = left;
        if (internal_root->size_table.ptr == nullptr)
          {
          idx -= subidx << shift;
          }
        else
          { // if (internal_root->size_table != NULL)
          const rrb_size_table<atomic_ref_counting> *table = internal_root->size_table.ptr;

          while (table->size[subidx] <= idx)
            {
            subidx++;
            }
          if (subidx != 0)
            {
            idx -= table->size[subidx - 1];
            }
          }

        const uint32_t last_slot = internal_root->len - 1;
        ref<tree_node<T, atomic_ref_counting>> child = internal_root->child[subidx];
        ref<tree_node<T, atomic_ref_counting>> left_hand_node = rrb_drop_left_rec<T, atomic_ref_counting, N>(total_shift, child, idx, subshift, (subidx != last_slot) | has_right);
        if (subidx == last_slot)
          { // No more slots left
          if (has_right)
            {
            ref<internal_node<T, atomic_ref_counting>> left_hand_parent = internal_node_create<T, atomic_ref_counting>(1);
            ref<internal_node<T, atomic_ref_counting>> internal_left_hand_node = left_hand_node;
            left_hand_parent->child[0] = internal_left_hand_node;

            if (subshift != 0 && internal_left_hand_node->size_table.ptr != nullptr)
              {
              ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(1);
              sliced_table->size[0] = internal_left_hand_node->size_table->size[internal_left_hand_node->len - 1];
              left_hand_parent->size_table = sliced_table;
              }
            *total_shift = shift;
            return left_hand_parent;
            }
          else
            { // if (!has_right)
            return left_hand_node;
            }
          }
        else
          { // if (subidx != last_slot)

          const uint32_t sliced_len = internal_root->len - subidx;
          ref<internal_node<T, atomic_ref_counting>> sliced_root = internal_node_create<T, atomic_ref_counting>(sliced_len);

          // TODO: Can shrink size here if sliced_len == 2, using the ambidextrous
          // vector technique w. offset. Takes constant time.

          for (uint32_t i = 0; i < (sliced_len - 1); ++i)
            sliced_root->child[1 + i] = internal_root->child[subidx + 1 + i];

          ref<rrb_size_table<atomic_ref_counting>> table = internal_root->size_table; // [JanM] copy seems unnecessary, todo

          // TODO: Can check if left is a power of the tree size. If so, all nodes
          // will be completely populated, and we can ignore the size table. Most
          // importantly, this will remove the need to alloc a size table, which
          // increases perf.
          ref<rrb_size_table<atomic_ref_counting>> sliced_table = size_table_create<atomic_ref_counting>(sliced_len);

          if (table.ptr == nullptr)
            {
            for (uint32_t i = 0; i < sliced_len; i++)
              {
              // left is total amount sliced off. By adding in subidx, we get faster
              // computation later on.
              sliced_table->size[i] = (subidx + 1 + i) << shift;
              // NOTE: This doesn't really work properly for top root, as last node
              // may have a higher count than it *actually* has. To remedy for this,
              // the top function performs a check afterwards, which may insert the
              // correct value if there's a size table in the root.
              }
            }
          else
            { // if (table != NULL)
            memcpy(sliced_table->size, &table->size[subidx], sliced_len * sizeof(uint32_t));
            }

          for (uint32_t i = 0; i < sliced_len; i++)
            {
            sliced_table->size[i] -= left;
            }

          sliced_root->size_table = sliced_table;
          sliced_root->child[0] = left_hand_node;
          *total_shift = shift;
          return sliced_root;
          }
        }
      else
        { // if (shift <= RRB_BRANCHING)
        ref<leaf_node<T, atomic_ref_counting>> leaf_root = root;
        const uint32_t right_vals_len = leaf_root->len - subidx;
        ref<leaf_node<T, atomic_ref_counting>> right_vals = leaf_node_create<T, atomic_ref_counting>(right_vals_len);

        //memcpy(right_vals->child, &leaf_root->child[subidx], right_vals_len * sizeof(T));
        for (uint32_t i = 0; i < right_vals_len; ++i)
          right_vals->child[i] = leaf_root->child[subidx + i]; // don't memcpy, but use copy constructor

        *total_shift = shift;

        return right_vals;
        }
      }